

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::SetProperty(cmTarget *this,string *prop,char *value)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  bool bVar4;
  __type _Var5;
  bool bVar6;
  TargetType TVar7;
  int iVar8;
  cmMessenger *messenger;
  cmTargetInternals *pcVar9;
  cmGlobalGenerator *this_00;
  ostream *poVar10;
  _Elt_pointer local_fa8;
  byte local_f91;
  string local_db8;
  ostringstream local_d98 [8];
  ostringstream e_7;
  allocator<char> local_c19;
  string local_c18;
  string local_bf8;
  ostringstream local_bd8 [8];
  ostringstream e_6;
  undefined1 local_a60 [8];
  cmListFileBacktrace lfbt_7;
  cmListFileBacktrace lfbt_6;
  cmListFileBacktrace lfbt_5;
  cmListFileBacktrace lfbt_4;
  cmListFileBacktrace lfbt_3;
  cmListFileBacktrace lfbt_2;
  cmListFileBacktrace lfbt_1;
  cmListFileBacktrace lfbt;
  ostringstream local_9c0 [8];
  ostringstream e_5;
  string local_848;
  ostringstream local_828 [8];
  ostringstream e_4;
  string local_6b0;
  ostringstream local_690 [8];
  ostringstream e_3;
  string local_518;
  ostringstream local_4f8 [8];
  ostringstream e_2;
  string local_380;
  ostringstream local_360 [8];
  ostringstream e_1;
  string local_1e8;
  ostringstream local_1c8 [8];
  ostringstream e;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d [13];
  _Elt_pointer local_20;
  char *value_local;
  string *prop_local;
  cmTarget *this_local;
  
  local_20 = (_Elt_pointer)value;
  value_local = (char *)prop;
  prop_local = (string *)this;
  TVar7 = GetType(this);
  pcVar3 = value_local;
  messenger = cmMakefile::GetMessenger(this->Makefile);
  cmMakefile::GetBacktrace((cmMakefile *)&stack0xffffffffffffffd0);
  bVar4 = cmTargetPropertyComputer::PassesWhitelist
                    (TVar7,(string *)pcVar3,messenger,
                     (cmListFileBacktrace *)&stack0xffffffffffffffd0);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&stack0xffffffffffffffd0);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_DEFINITIONS_abi_cxx11_ ==
         '\0') &&
       (iVar8 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propCOMPILE_DEFINITIONS_abi_cxx11_), iVar8 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_DEFINITIONS_abi_cxx11_,"COMPILE_DEFINITIONS",local_3d);
      std::allocator<char>::~allocator(local_3d);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propCOMPILE_DEFINITIONS_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propCOMPILE_DEFINITIONS_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_FEATURES_abi_cxx11_ ==
         '\0') &&
       (iVar8 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propCOMPILE_FEATURES_abi_cxx11_), iVar8 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_FEATURES_abi_cxx11_,"COMPILE_FEATURES",&local_3e);
      std::allocator<char>::~allocator(&local_3e);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propCOMPILE_FEATURES_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propCOMPILE_FEATURES_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_OPTIONS_abi_cxx11_ ==
         '\0') &&
       (iVar8 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propCOMPILE_OPTIONS_abi_cxx11_), iVar8 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_OPTIONS_abi_cxx11_,"COMPILE_OPTIONS",&local_3f);
      std::allocator<char>::~allocator(&local_3f);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propCOMPILE_OPTIONS_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propCOMPILE_OPTIONS_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCUDA_PTX_COMPILATION_abi_cxx11_
         == '\0') &&
       (iVar8 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propCUDA_PTX_COMPILATION_abi_cxx11_), iVar8 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCUDA_PTX_COMPILATION_abi_cxx11_,"CUDA_PTX_COMPILATION",&local_40);
      std::allocator<char>::~allocator(&local_40);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propCUDA_PTX_COMPILATION_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propCUDA_PTX_COMPILATION_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_ == '\0')
       && (iVar8 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                        propEXPORT_NAME_abi_cxx11_), iVar8 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_,
                 "EXPORT_NAME",&local_41);
      std::allocator<char>::~allocator(&local_41);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propEXPORT_NAME_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propIMPORTED_GLOBAL_abi_cxx11_ ==
         '\0') &&
       (iVar8 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propIMPORTED_GLOBAL_abi_cxx11_), iVar8 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propIMPORTED_GLOBAL_abi_cxx11_,"IMPORTED_GLOBAL",&local_42);
      std::allocator<char>::~allocator(&local_42);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propIMPORTED_GLOBAL_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propIMPORTED_GLOBAL_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propINCLUDE_DIRECTORIES_abi_cxx11_ ==
         '\0') &&
       (iVar8 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propINCLUDE_DIRECTORIES_abi_cxx11_), iVar8 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propINCLUDE_DIRECTORIES_abi_cxx11_,"INCLUDE_DIRECTORIES",&local_43);
      std::allocator<char>::~allocator(&local_43);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propINCLUDE_DIRECTORIES_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propINCLUDE_DIRECTORIES_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_ == '\0')
       && (iVar8 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                        propLINK_OPTIONS_abi_cxx11_), iVar8 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_,
                 "LINK_OPTIONS",&local_44);
      std::allocator<char>::~allocator(&local_44);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propLINK_OPTIONS_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propLINK_OPTIONS_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_DIRECTORIES_abi_cxx11_ ==
         '\0') &&
       (iVar8 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propLINK_DIRECTORIES_abi_cxx11_), iVar8 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propLINK_DIRECTORIES_abi_cxx11_,"LINK_DIRECTORIES",&local_45);
      std::allocator<char>::~allocator(&local_45);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propLINK_DIRECTORIES_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propLINK_DIRECTORIES_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_LIBRARIES_abi_cxx11_ == '\0'
        ) && (iVar8 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                           propLINK_LIBRARIES_abi_cxx11_), iVar8 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propLINK_LIBRARIES_abi_cxx11_,"LINK_LIBRARIES",&local_46);
      std::allocator<char>::~allocator(&local_46);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propLINK_LIBRARIES_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propLINK_LIBRARIES_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::
         propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_ == '\0') &&
       (iVar8 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_), iVar8 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,"MANUALLY_ADDED_DEPENDENCIES",&local_47
                );
      std::allocator<char>::~allocator(&local_47);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::
                    propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_ == '\0') &&
       (iVar8 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propNAME_abi_cxx11_), iVar8 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_,"NAME",
                 &local_48);
      std::allocator<char>::~allocator(&local_48);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_
                         );
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_ == '\0') &&
       (iVar8 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propSOURCES_abi_cxx11_), iVar8 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_,
                 "SOURCES",&local_49);
      std::allocator<char>::~allocator(&local_49);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                           propSOURCES_abi_cxx11_);
    }
    if ((SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_ == '\0') &&
       (iVar8 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propTYPE_abi_cxx11_), iVar8 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_,"TYPE",
                 &local_4a);
      std::allocator<char>::~allocator(&local_4a);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_
                         );
    }
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,
                            &SetProperty(std::__cxx11::string_const&,char_const*)::
                             propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    if (_Var5) {
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      std::operator<<((ostream *)local_1c8,"MANUALLY_ADDED_DEPENDENCIES property is read-only\n");
      pcVar1 = this->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream(local_1c8);
    }
    else {
      _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value_local,
                              &SetProperty(std::__cxx11::string_const&,char_const*)::
                               propNAME_abi_cxx11_);
      if (_Var5) {
        std::__cxx11::ostringstream::ostringstream(local_360);
        std::operator<<((ostream *)local_360,"NAME property is read-only\n");
        pcVar1 = this->Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_380);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::ostringstream::~ostringstream(local_360);
      }
      else {
        _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )value_local,
                                &SetProperty(std::__cxx11::string_const&,char_const*)::
                                 propTYPE_abi_cxx11_);
        if (_Var5) {
          std::__cxx11::ostringstream::ostringstream(local_4f8);
          std::operator<<((ostream *)local_4f8,"TYPE property is read-only\n");
          pcVar1 = this->Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_518);
          std::__cxx11::string::~string((string *)&local_518);
          std::__cxx11::ostringstream::~ostringstream(local_4f8);
        }
        else {
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)value_local,
                                  &SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propEXPORT_NAME_abi_cxx11_);
          if ((_Var5) && (bVar4 = IsImported(this), bVar4)) {
            std::__cxx11::ostringstream::ostringstream(local_690);
            poVar10 = std::operator<<((ostream *)local_690,
                                      "EXPORT_NAME property can\'t be set on imported targets (\"");
            poVar10 = std::operator<<(poVar10,(string *)&this->Name);
            std::operator<<(poVar10,"\")\n");
            pcVar1 = this->Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_6b0);
            std::__cxx11::string::~string((string *)&local_6b0);
            std::__cxx11::ostringstream::~ostringstream(local_690);
          }
          else {
            _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)value_local,
                                    &SetProperty(std::__cxx11::string_const&,char_const*)::
                                     propSOURCES_abi_cxx11_);
            if ((_Var5) && (bVar4 = IsImported(this), bVar4)) {
              std::__cxx11::ostringstream::ostringstream(local_828);
              poVar10 = std::operator<<((ostream *)local_828,
                                        "SOURCES property can\'t be set on imported targets (\"");
              poVar10 = std::operator<<(poVar10,(string *)&this->Name);
              std::operator<<(poVar10,"\")\n");
              pcVar1 = this->Makefile;
              std::__cxx11::ostringstream::str();
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_848);
              std::__cxx11::string::~string((string *)&local_848);
              std::__cxx11::ostringstream::~ostringstream(local_828);
            }
            else {
              _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)value_local,
                                      &SetProperty(std::__cxx11::string_const&,char_const*)::
                                       propIMPORTED_GLOBAL_abi_cxx11_);
              if ((!_Var5) || (bVar4 = IsImported(this), bVar4)) {
                _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)value_local,
                                        &SetProperty(std::__cxx11::string_const&,char_const*)::
                                         propINCLUDE_DIRECTORIES_abi_cxx11_);
                if (_Var5) {
                  pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::clear(&pcVar9->IncludeDirectoriesEntries);
                  pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                            (&pcVar9->IncludeDirectoriesBacktraces);
                  if (local_20 != (_Elt_pointer)0x0) {
                    pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const*&>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               pcVar9,(char **)&stack0xffffffffffffffe0);
                    cmMakefile::GetBacktrace
                              ((cmMakefile *)
                               &lfbt_1.TopEntry.
                                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                    pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&pcVar9->IncludeDirectoriesBacktraces,
                              (value_type *)
                              &lfbt_1.TopEntry.
                               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
                    cmListFileBacktrace::~cmListFileBacktrace
                              ((cmListFileBacktrace *)
                               &lfbt_1.TopEntry.
                                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                  }
                }
                else {
                  _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)value_local,
                                          &SetProperty(std::__cxx11::string_const&,char_const*)::
                                           propCOMPILE_OPTIONS_abi_cxx11_);
                  if (_Var5) {
                    pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::clear(&pcVar9->CompileOptionsEntries);
                    pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                              (&pcVar9->CompileOptionsBacktraces);
                    if (local_20 != (_Elt_pointer)0x0) {
                      pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<char_const*&>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&pcVar9->CompileOptionsEntries,(char **)&stack0xffffffffffffffe0
                                );
                      cmMakefile::GetBacktrace
                                ((cmMakefile *)
                                 &lfbt_2.TopEntry.
                                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&pcVar9->CompileOptionsBacktraces,
                                (value_type *)
                                &lfbt_2.TopEntry.
                                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
                      cmListFileBacktrace::~cmListFileBacktrace
                                ((cmListFileBacktrace *)
                                 &lfbt_2.TopEntry.
                                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                    }
                  }
                  else {
                    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)value_local,
                                            &SetProperty(std::__cxx11::string_const&,char_const*)::
                                             propCOMPILE_FEATURES_abi_cxx11_);
                    if (_Var5) {
                      pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::clear(&pcVar9->CompileFeaturesEntries);
                      pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                                (&pcVar9->CompileFeaturesBacktraces);
                      if (local_20 != (_Elt_pointer)0x0) {
                        pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<char_const*&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&pcVar9->CompileFeaturesEntries,
                                   (char **)&stack0xffffffffffffffe0);
                        cmMakefile::GetBacktrace
                                  ((cmMakefile *)
                                   &lfbt_3.TopEntry.
                                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                        pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        push_back(&pcVar9->CompileFeaturesBacktraces,
                                  (value_type *)
                                  &lfbt_3.TopEntry.
                                   super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
                        cmListFileBacktrace::~cmListFileBacktrace
                                  ((cmListFileBacktrace *)
                                   &lfbt_3.TopEntry.
                                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                      }
                    }
                    else {
                      _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)value_local,
                                              &SetProperty(std::__cxx11::string_const&,char_const*)
                                               ::propCOMPILE_DEFINITIONS_abi_cxx11_);
                      if (_Var5) {
                        pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::clear(&pcVar9->CompileDefinitionsEntries);
                        pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        clear(&pcVar9->CompileDefinitionsBacktraces);
                        if (local_20 != (_Elt_pointer)0x0) {
                          pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<char_const*&>
                                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&pcVar9->CompileDefinitionsEntries,
                                     (char **)&stack0xffffffffffffffe0);
                          cmMakefile::GetBacktrace
                                    ((cmMakefile *)
                                     &lfbt_4.TopEntry.
                                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                          pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                          push_back(&pcVar9->CompileDefinitionsBacktraces,
                                    (value_type *)
                                    &lfbt_4.TopEntry.
                                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
                          cmListFileBacktrace::~cmListFileBacktrace
                                    ((cmListFileBacktrace *)
                                     &lfbt_4.TopEntry.
                                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                        }
                      }
                      else {
                        _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)value_local,
                                                &SetProperty(std::__cxx11::string_const&,char_const*)
                                                 ::propLINK_OPTIONS_abi_cxx11_);
                        if (_Var5) {
                          pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::clear(&pcVar9->LinkOptionsEntries);
                          pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                          clear(&pcVar9->LinkOptionsBacktraces);
                          if (local_20 != (_Elt_pointer)0x0) {
                            pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            emplace_back<char_const*&>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&pcVar9->LinkOptionsEntries,
                                       (char **)&stack0xffffffffffffffe0);
                            cmMakefile::GetBacktrace
                                      ((cmMakefile *)
                                       &lfbt_5.TopEntry.
                                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                            pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            push_back(&pcVar9->LinkOptionsBacktraces,
                                      (value_type *)
                                      &lfbt_5.TopEntry.
                                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
                            cmListFileBacktrace::~cmListFileBacktrace
                                      ((cmListFileBacktrace *)
                                       &lfbt_5.TopEntry.
                                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                          }
                        }
                        else {
                          _Var5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  &
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propLINK_DIRECTORIES_abi_cxx11_);
                          if (_Var5) {
                            pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::clear(&pcVar9->LinkDirectoriesEntries);
                            pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            clear(&pcVar9->LinkDirectoriesBacktraces);
                            if (local_20 != (_Elt_pointer)0x0) {
                              pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                              ::emplace_back<char_const*&>
                                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                          *)&pcVar9->LinkDirectoriesEntries,
                                         (char **)&stack0xffffffffffffffe0);
                              cmMakefile::GetBacktrace
                                        ((cmMakefile *)
                                         &lfbt_6.TopEntry.
                                          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                              pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                              ::push_back(&pcVar9->LinkDirectoriesBacktraces,
                                          (value_type *)
                                          &lfbt_6.TopEntry.
                                           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount);
                              cmListFileBacktrace::~cmListFileBacktrace
                                        ((cmListFileBacktrace *)
                                         &lfbt_6.TopEntry.
                                          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                            }
                          }
                          else {
                            _Var5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  &
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propLINK_LIBRARIES_abi_cxx11_);
                            if (_Var5) {
                              pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::clear(&pcVar9->LinkImplementationPropertyEntries);
                              pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                              ::clear(&pcVar9->LinkImplementationPropertyBacktraces);
                              if (local_20 != (_Elt_pointer)0x0) {
                                cmMakefile::GetBacktrace
                                          ((cmMakefile *)
                                           &lfbt_7.TopEntry.
                                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount);
                                pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                                std::
                                vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                                emplace_back<char_const*&>
                                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                            *)&pcVar9->LinkImplementationPropertyEntries,
                                           (char **)&stack0xffffffffffffffe0);
                                pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                                std::
                                vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                                push_back(&pcVar9->LinkImplementationPropertyBacktraces,
                                          (value_type *)
                                          &lfbt_7.TopEntry.
                                           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount);
                                cmListFileBacktrace::~cmListFileBacktrace
                                          ((cmListFileBacktrace *)
                                           &lfbt_7.TopEntry.
                                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount);
                              }
                            }
                            else {
                              _Var5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  &
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propSOURCES_abi_cxx11_);
                              if (_Var5) {
                                pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::clear(&pcVar9->SourceEntries);
                                pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                                std::
                                vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                                clear(&pcVar9->SourceBacktraces);
                                if (local_20 != (_Elt_pointer)0x0) {
                                  cmMakefile::GetBacktrace((cmMakefile *)local_a60);
                                  pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                                  std::
                                  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  ::emplace_back<char_const*&>
                                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                              *)&pcVar9->SourceEntries,
                                             (char **)&stack0xffffffffffffffe0);
                                  pcVar9 = cmTargetInternalPointer::operator->(&this->Internal);
                                  std::
                                  vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>
                                  ::push_back(&pcVar9->SourceBacktraces,(value_type *)local_a60);
                                  cmListFileBacktrace::~cmListFileBacktrace
                                            ((cmListFileBacktrace *)local_a60);
                                }
                              }
                              else {
                                _Var5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  &
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propIMPORTED_GLOBAL_abi_cxx11_);
                                if (_Var5) {
                                  bVar4 = cmSystemTools::IsOn((char *)local_20);
                                  if (bVar4) {
                                    if ((this->ImportedGloballyVisible & 1U) == 0) {
                                      this->ImportedGloballyVisible = true;
                                      this_00 = GetGlobalGenerator(this);
                                      cmGlobalGenerator::IndexTarget(this_00,this);
                                    }
                                  }
                                  else {
                                    std::__cxx11::ostringstream::ostringstream(local_bd8);
                                    poVar10 = std::operator<<((ostream *)local_bd8,
                                                                                                                            
                                                  "IMPORTED_GLOBAL property can\'t be set to FALSE on targets (\""
                                                  );
                                    poVar10 = std::operator<<(poVar10,(string *)&this->Name);
                                    std::operator<<(poVar10,"\")\n");
                                    pcVar1 = this->Makefile;
                                    std::__cxx11::ostringstream::str();
                                    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_bf8);
                                    std::__cxx11::string::~string((string *)&local_bf8);
                                    std::__cxx11::ostringstream::~ostringstream(local_bd8);
                                  }
                                }
                                else {
                                  bVar6 = cmHasLiteralPrefix<std::__cxx11::string,17ul>
                                                    ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,(char (*) [17])"IMPORTED_LIBNAME");
                                  pcVar3 = value_local;
                                  bVar2 = false;
                                  bVar4 = false;
                                  local_f91 = 0;
                                  if (bVar6) {
                                    if (local_20 == (_Elt_pointer)0x0) {
                                      local_fa8 = (_Elt_pointer)0x7cf240;
                                    }
                                    else {
                                      local_fa8 = local_20;
                                    }
                                    std::allocator<char>::allocator();
                                    bVar2 = true;
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_c18,(char *)local_fa8,&local_c19);
                                    bVar4 = true;
                                    bVar6 = CheckImportedLibName(this,(string *)pcVar3,&local_c18);
                                    local_f91 = bVar6 ^ 0xff;
                                  }
                                  if (bVar4) {
                                    std::__cxx11::string::~string((string *)&local_c18);
                                  }
                                  if (bVar2) {
                                    std::allocator<char>::~allocator(&local_c19);
                                  }
                                  if ((local_f91 & 1) == 0) {
                                    _Var5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  &
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propCUDA_PTX_COMPILATION_abi_cxx11_);
                                    if ((_Var5) && (TVar7 = GetType(this), TVar7 != OBJECT_LIBRARY))
                                    {
                                      std::__cxx11::ostringstream::ostringstream(local_d98);
                                      poVar10 = std::operator<<((ostream *)local_d98,
                                                                                                                                
                                                  "CUDA_PTX_COMPILATION property can only be applied to OBJECT targets (\""
                                                  );
                                      poVar10 = std::operator<<(poVar10,(string *)&this->Name);
                                      std::operator<<(poVar10,"\")\n");
                                      pcVar1 = this->Makefile;
                                      std::__cxx11::ostringstream::str();
                                      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_db8);
                                      std::__cxx11::string::~string((string *)&local_db8);
                                      std::__cxx11::ostringstream::~ostringstream(local_d98);
                                    }
                                    else {
                                      cmPropertyMap::SetProperty
                                                (&this->Properties,(string *)value_local,
                                                 (char *)local_20);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                std::__cxx11::ostringstream::ostringstream(local_9c0);
                poVar10 = std::operator<<((ostream *)local_9c0,
                                          "IMPORTED_GLOBAL property can\'t be set on non-imported targets (\""
                                         );
                poVar10 = std::operator<<(poVar10,(string *)&this->Name);
                std::operator<<(poVar10,"\")\n");
                pcVar1 = this->Makefile;
                std::__cxx11::ostringstream::str();
                cmMakefile::IssueMessage
                          (pcVar1,FATAL_ERROR,
                           (string *)
                           &lfbt.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                std::__cxx11::string::~string
                          ((string *)
                           &lfbt.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                std::__cxx11::ostringstream::~ostringstream(local_9c0);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmTarget::SetProperty(const std::string& prop, const char* value)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->Makefile->GetBacktrace())) {
    return;
  }
#define MAKE_STATIC_PROP(PROP) static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(CUDA_PTX_COMPILATION);
  MAKE_STATIC_PROP(EXPORT_NAME);
  MAKE_STATIC_PROP(IMPORTED_GLOBAL);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(LINK_OPTIONS);
  MAKE_STATIC_PROP(LINK_DIRECTORIES);
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(MANUALLY_ADDED_DEPENDENCIES);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(SOURCES);
  MAKE_STATIC_PROP(TYPE);
#undef MAKE_STATIC_PROP
  if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
    std::ostringstream e;
    e << "MANUALLY_ADDED_DEPENDENCIES property is read-only\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propNAME) {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propTYPE) {
    std::ostringstream e;
    e << "TYPE property is read-only\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propEXPORT_NAME && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propSOURCES && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << this->Name
      << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propIMPORTED_GLOBAL && !this->IsImported()) {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be set on non-imported targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (prop == propINCLUDE_DIRECTORIES) {
    this->Internal->IncludeDirectoriesEntries.clear();
    this->Internal->IncludeDirectoriesBacktraces.clear();
    if (value) {
      this->Internal->IncludeDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_OPTIONS) {
    this->Internal->CompileOptionsEntries.clear();
    this->Internal->CompileOptionsBacktraces.clear();
    if (value) {
      this->Internal->CompileOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_FEATURES) {
    this->Internal->CompileFeaturesEntries.clear();
    this->Internal->CompileFeaturesBacktraces.clear();
    if (value) {
      this->Internal->CompileFeaturesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_DEFINITIONS) {
    this->Internal->CompileDefinitionsEntries.clear();
    this->Internal->CompileDefinitionsBacktraces.clear();
    if (value) {
      this->Internal->CompileDefinitionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_OPTIONS) {
    this->Internal->LinkOptionsEntries.clear();
    this->Internal->LinkOptionsBacktraces.clear();
    if (value) {
      this->Internal->LinkOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_DIRECTORIES) {
    this->Internal->LinkDirectoriesEntries.clear();
    this->Internal->LinkDirectoriesBacktraces.clear();
    if (value) {
      this->Internal->LinkDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_LIBRARIES) {
    this->Internal->LinkImplementationPropertyEntries.clear();
    this->Internal->LinkImplementationPropertyBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkImplementationPropertyEntries.emplace_back(value);
      this->Internal->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == propSOURCES) {
    this->Internal->SourceEntries.clear();
    this->Internal->SourceBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->SourceEntries.emplace_back(value);
      this->Internal->SourceBacktraces.push_back(lfbt);
    }
  } else if (prop == propIMPORTED_GLOBAL) {
    if (!cmSystemTools::IsOn(value)) {
      std::ostringstream e;
      e << "IMPORTED_GLOBAL property can't be set to FALSE on targets (\""
        << this->Name << "\")\n";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    /* no need to change anything if value does not change */
    if (!this->ImportedGloballyVisible) {
      this->ImportedGloballyVisible = true;
      this->GetGlobalGenerator()->IndexTarget(this);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME") &&
             !this->CheckImportedLibName(prop, value ? value : "")) {
    /* error was reported by check method */
  } else if (prop == propCUDA_PTX_COMPILATION &&
             this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "CUDA_PTX_COMPILATION property can only be applied to OBJECT "
         "targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  } else {
    this->Properties.SetProperty(prop, value);
  }
}